

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int pattern_search(FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int search_step,
                  int do_init_search,int *cost_list,FULLPEL_MV *best_mv,
                  FULLPEL_MV_STATS *best_mv_stats)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  FULLPEL_MOTION_SEARCH_PARAMS *in_RSI;
  undefined4 in_EDI;
  FULLPEL_MOTION_SEARCH_PARAMS *in_R8;
  MV *in_R9;
  int var_cost;
  FULLPEL_MV center_mv_4;
  int next_chkpts_indices_1 [3];
  FULLPEL_MV center_mv_3;
  FULLPEL_MV center_mv_2;
  int next_chkpts_indices [3];
  int remaining_cand_1;
  int no_of_4_cand_loops_1;
  FULLPEL_MV center_mv_1;
  int best_site_1;
  int last_s;
  int remaining_cand;
  int no_of_4_cand_loops;
  FULLPEL_MV center_mv;
  int best_site;
  uint8_t *center_address;
  int costlist_has_sad;
  int best_init_s;
  MV_COST_PARAMS *mv_cost_params;
  int k;
  uint raw_bestsad;
  uint bestsad;
  int bc;
  int br;
  int last_is_4;
  int ref_stride;
  int *num_candidates;
  search_site_config *search_sites;
  buf_2d *ref;
  buf_2d *src;
  int t;
  int s;
  int i;
  FULLPEL_MV this_mv_2;
  int idx;
  MV_COST_PARAMS *mv_cost_params_1;
  FULLPEL_MV this_mv_1;
  int i_2;
  FULLPEL_MV this_mv;
  int i_1;
  int bc_1;
  int br_1;
  int ref_stride_1;
  buf_2d *ref_1;
  buf_2d *src_1;
  MV_COST_PARAMS *in_stack_fffffffffffffe08;
  FULLPEL_MV in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  int *in_stack_fffffffffffffe18;
  int *in_stack_fffffffffffffe20;
  uint uVar4;
  undefined4 uVar5;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe28;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe30;
  uint *in_stack_fffffffffffffe38;
  uint8_t *in_stack_fffffffffffffe40;
  FULLPEL_MV *in_stack_fffffffffffffe48;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe50;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe58;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffe60;
  FULLPEL_MOTION_SEARCH_PARAMS *pFVar6;
  uint *in_stack_fffffffffffffe68;
  FULLPEL_MOTION_SEARCH_PARAMS *bestsad_00;
  undefined4 in_stack_fffffffffffffe70;
  int iVar7;
  undefined4 in_stack_fffffffffffffe74;
  int iVar8;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  uint uVar9;
  MV_COST_PARAMS *mv_cost_params_00;
  undefined4 in_stack_fffffffffffffe98;
  FULLPEL_MV in_stack_fffffffffffffea4;
  int in_stack_fffffffffffffea8;
  int search_step_00;
  int local_154;
  undefined4 in_stack_fffffffffffffeb0;
  int iVar10;
  undefined4 in_stack_fffffffffffffeb4;
  int iVar11;
  undefined2 in_stack_fffffffffffffeb8;
  undefined2 uVar12;
  int16_t in_stack_fffffffffffffeba;
  int16_t iVar13;
  undefined2 in_stack_fffffffffffffebc;
  int16_t in_stack_fffffffffffffebe;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed4;
  int16_t in_stack_fffffffffffffed6;
  int local_128;
  uint local_124;
  int local_120;
  int local_11c;
  undefined2 local_118;
  int16_t iStack_116;
  int local_114;
  uint8_t *local_110;
  int local_108;
  FULLPEL_MV local_104;
  MV_COST_PARAMS *local_100;
  int local_f4;
  undefined1 local_f0 [48];
  MV_COST_PARAMS *local_c0;
  FULLPEL_MV local_b4;
  FULLPEL_MV local_b0;
  int local_ac;
  MV *local_a8;
  FULLPEL_MOTION_SEARCH_PARAMS *local_a0;
  int local_98;
  int local_94;
  FULLPEL_MOTION_SEARCH_PARAMS *local_90;
  undefined4 local_84;
  short local_80;
  short local_7e;
  int local_7c;
  MV_COST_PARAMS *local_78;
  FULLPEL_MV local_6c;
  int local_68;
  short local_64;
  short local_62;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  buf_2d *local_50;
  FULLPEL_MOTION_SEARCH_PARAMS *local_48;
  int local_3c;
  FULLPEL_MOTION_SEARCH_PARAMS *local_38;
  FULLPEL_MOTION_SEARCH_PARAMS *local_30;
  MV local_24;
  
  local_c0 = (MV_COST_PARAMS *)(in_RSI->ms_buffers).src;
  local_f0._40_8_ = (in_RSI->ms_buffers).ref;
  local_f0._32_8_ = in_RSI->search_sites;
  local_f0._24_8_ = ((search_site_config *)local_f0._32_8_)->searches_per_step;
  local_f0._20_4_ = ((buf_2d *)local_f0._40_8_)->stride;
  local_f0._16_4_ = ZEXT14(*(int *)local_f0._24_8_ == 4);
  local_f0._4_4_ = -1;
  local_f0._0_4_ = -1;
  local_f4 = -1;
  local_100 = &in_RSI->mv_cost_params;
  if (9 < in_EDX) {
    in_EDX = 10;
  }
  local_104 = *(FULLPEL_MV *)(pattern_search::search_steps + in_EDX);
  local_a8 = in_R9;
  local_a0 = in_R8;
  local_98 = in_ECX;
  local_94 = in_EDX;
  local_90 = in_RSI;
  local_84 = in_EDI;
  clamp_fullmv((FULLPEL_MV *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
               (FullMvLimits *)in_stack_fffffffffffffe08);
  local_f0._12_4_ = SEXT24((short)local_84);
  local_f0._8_4_ = SEXT24(local_84._2_2_);
  if (local_a0 != (FULLPEL_MOTION_SEARCH_PARAMS *)0x0) {
    *(int *)&(local_a0->ms_buffers).ref = 0x7fffffff;
    *(undefined4 *)((long)&local_a0->vfp + 4) = 0x7fffffff;
    *(undefined4 *)&local_a0->vfp = 0x7fffffff;
    *(undefined4 *)&local_a0->field_0x4 = 0x7fffffff;
    *(int *)local_a0 = 0x7fffffff;
  }
  local_108 = 0;
  pFVar6 = local_90;
  mv_cost_params_00 = local_c0;
  get_buf_from_fullmv((buf_2d *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                      (FULLPEL_MV *)in_stack_fffffffffffffe08);
  iVar1 = get_mvpred_sad(in_stack_fffffffffffffe30,(buf_2d *)in_stack_fffffffffffffe28,
                         (uint8_t *)in_stack_fffffffffffffe20,
                         (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  local_f0._0_4_ = iVar1;
  local_f0._4_4_ =
       mvsad_err_cost_((FULLPEL_MV *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                       in_stack_fffffffffffffe08);
  local_f0._4_4_ = iVar1 + local_f0._4_4_;
  local_110 = get_buf_from_fullmv((buf_2d *)
                                  CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                  (FULLPEL_MV *)in_stack_fffffffffffffe08);
  if (local_98 != 0) {
    local_b0 = local_104;
    local_104.row = -1;
    local_104.col = -1;
    local_b4.row = 0;
    local_b4.col = 0;
    for (; (int)local_b4 <= (int)local_b0; local_b4 = (FULLPEL_MV)((int)local_b4 + 1)) {
      local_114 = -1;
      local_118 = (undefined2)local_f0._12_4_;
      iStack_116 = (int16_t)local_f0._8_4_;
      iVar2 = check_bounds(&local_90->mv_limits,local_f0._12_4_,local_f0._8_4_,
                           1 << ((byte)local_b4.row & 0x1f));
      if (iVar2 == 0) {
        in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
        in_stack_fffffffffffffe18 = &local_114;
        in_stack_fffffffffffffe20 =
             (int *)CONCAT44((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                             *(int *)(local_f0._24_8_ + (long)(int)local_b4 * 4));
        in_stack_fffffffffffffe28 =
             (FULLPEL_MOTION_SEARCH_PARAMS *)((ulong)in_stack_fffffffffffffe28 & 0xffffffff00000000)
        ;
        in_stack_fffffffffffffe30 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
        in_stack_fffffffffffffe10 = local_b4;
        calc_sad_update_bestmv
                  (in_stack_fffffffffffffe58,(MV_COST_PARAMS *)in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                   in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (uint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe78,
                   (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),(int)pFVar6,
                   (int)mv_cost_params_00,(int *)CONCAT44(iVar1,in_stack_fffffffffffffe98));
      }
      else {
        local_11c = *(int *)(local_f0._24_8_ + (long)(int)local_b4 * 4) >> 2;
        for (local_ac = 0; uVar9 = (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20),
            local_ac < local_11c; local_ac = local_ac + 1) {
          in_stack_fffffffffffffe20 = (int *)((ulong)uVar9 << 0x20);
          in_stack_fffffffffffffe28 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
          calc_sad4_update_bestmv
                    ((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(iVar1,in_stack_fffffffffffffe98),
                     mv_cost_params_00,(FULLPEL_MV *)pFVar6,in_stack_fffffffffffffea4,
                     (uint8_t *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (uint *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     (uint *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     CONCAT22(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8),
                     (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffec8,
                     (int *)CONCAT26(in_stack_fffffffffffffed6,
                                     CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)))
          ;
        }
        local_120 = *(int *)(local_f0._24_8_ + (long)(int)local_b4 * 4) % 4;
        in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
        in_stack_fffffffffffffe18 = &local_114;
        in_stack_fffffffffffffe20 = (int *)CONCAT44(uVar9,local_120);
        in_stack_fffffffffffffe28 =
             (FULLPEL_MOTION_SEARCH_PARAMS *)
             CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),local_11c << 2);
        in_stack_fffffffffffffe30 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
        in_stack_fffffffffffffe10 = local_b4;
        calc_sad_update_bestmv
                  (in_stack_fffffffffffffe58,(MV_COST_PARAMS *)in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                   in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                   (uint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                   in_stack_fffffffffffffe78,
                   (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),(int)pFVar6,
                   (int)mv_cost_params_00,(int *)CONCAT44(iVar1,in_stack_fffffffffffffe98));
      }
      if (local_114 != -1) {
        local_104 = local_b4;
        local_f4 = local_114;
      }
    }
    if (local_104 != (FULLPEL_MV)0xffffffff) {
      local_f0._12_4_ =
           (int)((search_site (*) [17])local_f0._32_8_)[(int)local_104][local_f4].mv.row +
           local_f0._12_4_;
      local_f0._8_4_ =
           (int)((search_site (*) [17])local_f0._32_8_)[(int)local_104][local_f4].mv.col +
           local_f0._8_4_;
      local_110 = local_110 +
                  ((search_site (*) [17])local_f0._32_8_)[(int)local_104][local_f4].offset;
    }
  }
  if (local_104 != (FULLPEL_MV)0xffffffff) {
    uVar9 = in_stack_fffffffffffffe84 & 0xffffff;
    if (local_f0._16_4_ != 0) {
      uVar9 = CONCAT13(local_a0 != (FULLPEL_MOTION_SEARCH_PARAMS *)0x0,
                       (int3)in_stack_fffffffffffffe84);
    }
    local_124 = uVar9 >> 0x18;
    local_128 = -1;
    local_b0 = local_104;
    while( true ) {
      uVar12 = (undefined2)local_f0._12_4_;
      iVar13 = (int16_t)local_f0._8_4_;
      if ((int)local_b0 < (int)local_124) break;
      if ((local_98 == 0) || (local_b0 != local_104)) {
        iVar2 = check_bounds(&local_90->mv_limits,local_f0._12_4_,local_f0._8_4_,
                             1 << ((byte)local_b0.row & 0x1f));
        if (iVar2 == 0) {
          in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
          in_stack_fffffffffffffe18 = &local_128;
          in_stack_fffffffffffffe20 =
               (int *)CONCAT44((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),
                               *(int *)(local_f0._24_8_ + (long)(int)local_b0 * 4));
          in_stack_fffffffffffffe28 =
               (FULLPEL_MOTION_SEARCH_PARAMS *)
               ((ulong)in_stack_fffffffffffffe28 & 0xffffffff00000000);
          in_stack_fffffffffffffe30 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
          in_stack_fffffffffffffe10 = local_b0;
          calc_sad_update_bestmv
                    (in_stack_fffffffffffffe58,(MV_COST_PARAMS *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (uint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe78,(int *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                     (int)pFVar6,(int)mv_cost_params_00,
                     (int *)CONCAT44(iVar1,in_stack_fffffffffffffe98));
          in_stack_fffffffffffffed4 = uVar12;
          in_stack_fffffffffffffed6 = iVar13;
        }
        else {
          in_stack_fffffffffffffed0 = *(int *)(local_f0._24_8_ + (long)(int)local_b0 * 4) >> 2;
          for (local_ac = 0; uVar4 = (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20),
              local_ac < in_stack_fffffffffffffed0; local_ac = local_ac + 1) {
            in_stack_fffffffffffffe20 = (int *)((ulong)uVar4 << 0x20);
            in_stack_fffffffffffffe28 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
            calc_sad4_update_bestmv
                      ((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(iVar1,in_stack_fffffffffffffe98),
                       mv_cost_params_00,(FULLPEL_MV *)pFVar6,in_stack_fffffffffffffea4,
                       (uint8_t *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                       (uint *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       (uint *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       CONCAT22(in_stack_fffffffffffffeba,in_stack_fffffffffffffeb8),
                       (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                       in_stack_fffffffffffffec8,
                       (int *)CONCAT26(iVar13,CONCAT24(uVar12,in_stack_fffffffffffffed0)));
          }
          in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
          in_stack_fffffffffffffe18 = &local_128;
          in_stack_fffffffffffffe20 =
               (int *)CONCAT44(uVar4,*(int *)(local_f0._24_8_ + (long)(int)local_b0 * 4) % 4);
          in_stack_fffffffffffffe28 =
               (FULLPEL_MOTION_SEARCH_PARAMS *)
               CONCAT44((int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                        in_stack_fffffffffffffed0 << 2);
          in_stack_fffffffffffffe30 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
          in_stack_fffffffffffffe10 = local_b0;
          calc_sad_update_bestmv
                    (in_stack_fffffffffffffe58,(MV_COST_PARAMS *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (uint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe78,(int *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                     (int)pFVar6,(int)mv_cost_params_00,
                     (int *)CONCAT44(iVar1,in_stack_fffffffffffffe98));
          in_stack_fffffffffffffed4 = uVar12;
          in_stack_fffffffffffffed6 = iVar13;
        }
        if (local_128 != -1) {
          local_f0._12_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_128].mv.row +
               local_f0._12_4_;
          local_f0._8_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_128].mv.col +
               local_f0._8_4_;
          local_110 = local_110 +
                      ((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_128].offset;
          local_f4 = local_128;
          goto LAB_0027b8eb;
        }
      }
      else {
LAB_0027b8eb:
        while( true ) {
          uVar5 = (undefined4)((ulong)in_stack_fffffffffffffe20 >> 0x20);
          local_128 = -1;
          in_stack_fffffffffffffe80 = local_f4;
          if (local_f4 == 0) {
            in_stack_fffffffffffffe80 = *(int *)(local_f0._24_8_ + (long)(int)local_b0 * 4);
          }
          in_stack_fffffffffffffe80 = in_stack_fffffffffffffe80 + -1;
          if (local_f4 == *(int *)(local_f0._24_8_ + (long)(int)local_b0 * 4) + -1) {
            in_stack_fffffffffffffe7c = 0;
          }
          else {
            in_stack_fffffffffffffe7c = local_f4 + 1;
          }
          in_stack_fffffffffffffebc = (undefined2)local_f0._12_4_;
          in_stack_fffffffffffffebe = (int16_t)local_f0._8_4_;
          in_stack_fffffffffffffec0 = in_stack_fffffffffffffe80;
          in_stack_fffffffffffffec4 = local_f4;
          in_stack_fffffffffffffec8 = in_stack_fffffffffffffe7c;
          iVar2 = check_bounds(&local_90->mv_limits,local_f0._12_4_,local_f0._8_4_,
                               1 << ((byte)local_b0.row & 0x1f));
          in_stack_fffffffffffffe10 = local_b0;
          if (iVar2 == 0) {
            in_stack_fffffffffffffe28 = (FULLPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffec0;
            in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
            in_stack_fffffffffffffe18 = &local_128;
            in_stack_fffffffffffffe20 = (int *)CONCAT44(uVar5,3);
            in_stack_fffffffffffffe30 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
            calc_sad_update_bestmv_with_indices
                      (in_stack_fffffffffffffe58,(MV_COST_PARAMS *)in_stack_fffffffffffffe50,
                       in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                       in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                       (uint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe78,(int *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                       (int)pFVar6,(int *)mv_cost_params_00,
                       (int *)CONCAT44(iVar1,in_stack_fffffffffffffe98));
          }
          else {
            in_stack_fffffffffffffe20 = (int *)&stack0xfffffffffffffec0;
            in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
            in_stack_fffffffffffffe18 = &local_128;
            in_stack_fffffffffffffe28 = (FULLPEL_MOTION_SEARCH_PARAMS *)0x0;
            calc_sad3_update_bestmv
                      (pFVar6,(MV_COST_PARAMS *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                       (FULLPEL_MV *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                       SUB84((ulong)mv_cost_params_00 >> 0x20,0),
                       (uint8_t *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                       in_stack_fffffffffffffe68,(uint *)CONCAT44(in_stack_fffffffffffffea4,in_EDX),
                       in_stack_fffffffffffffea8,
                       (int *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                       (int *)CONCAT26(in_stack_fffffffffffffebe,
                                       CONCAT24(in_stack_fffffffffffffebc,
                                                CONCAT22(in_stack_fffffffffffffeba,
                                                         in_stack_fffffffffffffeb8))),
                       (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          }
          if (local_128 == -1) break;
          local_f4 = *(int *)(&stack0xfffffffffffffec0 + (long)local_128 * 4);
          local_f0._12_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_f4].mv.row +
               local_f0._12_4_;
          local_f0._8_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_f4].mv.col +
               local_f0._8_4_;
          local_110 = local_110 +
                      ((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_f4].offset;
        }
      }
      local_b0 = (FULLPEL_MV)((int)local_b0 + -1);
    }
    if (local_b0 == (FULLPEL_MV)0x0) {
      *(undefined4 *)local_a0 = local_f0._0_4_;
      local_108 = 1;
      if ((local_98 == 0) || (local_104 != (FULLPEL_MV)0x0)) {
        iVar2 = check_bounds(&local_90->mv_limits,local_f0._12_4_,local_f0._8_4_,
                             1 << ((byte)local_b0.row & 0x1f));
        uVar4 = (uint)((ulong)in_stack_fffffffffffffe20 >> 0x20);
        in_stack_fffffffffffffe10 = local_b0;
        if (iVar2 == 0) {
          in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
          in_stack_fffffffffffffe18 = &local_128;
          in_stack_fffffffffffffe20 = (int *)CONCAT44(uVar4,4);
          in_stack_fffffffffffffe28 =
               (FULLPEL_MOTION_SEARCH_PARAMS *)
               ((ulong)in_stack_fffffffffffffe28 & 0xffffffff00000000);
          in_stack_fffffffffffffe30 = local_a0;
          calc_sad_update_bestmv
                    (in_stack_fffffffffffffe58,(MV_COST_PARAMS *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (uint *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                     in_stack_fffffffffffffe78,(int *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                     (int)pFVar6,(int)mv_cost_params_00,
                     (int *)CONCAT44(iVar1,in_stack_fffffffffffffe98));
          in_stack_fffffffffffffeb8 = uVar12;
          in_stack_fffffffffffffeba = iVar13;
        }
        else {
          in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
          in_stack_fffffffffffffe18 = &local_128;
          in_stack_fffffffffffffe20 = (int *)((ulong)uVar4 << 0x20);
          in_stack_fffffffffffffe28 = local_a0;
          calc_sad4_update_bestmv
                    ((FULLPEL_MOTION_SEARCH_PARAMS *)CONCAT44(iVar1,in_stack_fffffffffffffe98),
                     mv_cost_params_00,(FULLPEL_MV *)pFVar6,in_stack_fffffffffffffea4,
                     (uint8_t *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                     (uint *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                     (uint *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     CONCAT22(iVar13,uVar12),
                     (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffec8,
                     (int *)CONCAT26(in_stack_fffffffffffffed6,
                                     CONCAT24(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)))
          ;
          in_stack_fffffffffffffeb8 = uVar12;
          in_stack_fffffffffffffeba = iVar13;
        }
        if (local_128 != -1) {
          local_f0._12_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_128].mv.row +
               local_f0._12_4_;
          local_f0._8_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_128].mv.col +
               local_f0._8_4_;
          local_110 = local_110 +
                      ((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_128].offset;
          local_f4 = local_128;
        }
      }
      while (local_128 != -1) {
        local_128 = -1;
        iVar2 = local_f4;
        if (local_f4 == 0) {
          iVar2 = *(int *)(local_f0._24_8_ + (long)(int)local_b0 * 4);
        }
        iVar2 = iVar2 + -1;
        if (local_f4 == *(int *)(local_f0._24_8_ + (long)(int)local_b0 * 4) + -1) {
          iVar8 = 0;
        }
        else {
          iVar8 = local_f4 + 1;
        }
        *(int *)&(local_a0->ms_buffers).ref = 0x7fffffff;
        *(undefined4 *)((long)&local_a0->vfp + 4) = 0x7fffffff;
        *(undefined4 *)&local_a0->vfp = 0x7fffffff;
        *(undefined4 *)&local_a0->field_0x4 = 0x7fffffff;
        iVar7 = *(int *)local_a0;
        *(int *)((long)local_a0->mesh_patterns + (long)((local_f4 + 2) % 4 + 1) * 4 + -0x78) = iVar7
        ;
        *(undefined4 *)local_a0 = local_f0._0_4_;
        search_step_00 = CONCAT22((int16_t)local_f0._8_4_,(short)local_f0._12_4_);
        bestsad_00 = local_a0;
        local_154 = iVar2;
        iVar10 = local_f4;
        iVar11 = iVar8;
        iVar3 = check_bounds(&local_90->mv_limits,local_f0._12_4_,local_f0._8_4_,
                             1 << ((byte)local_b0.row & 0x1f));
        in_stack_fffffffffffffe10 = local_b0;
        if (iVar3 == 0) {
          in_stack_fffffffffffffe28 = (FULLPEL_MOTION_SEARCH_PARAMS *)&local_154;
          in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
          in_stack_fffffffffffffe18 = &local_128;
          in_stack_fffffffffffffe20 =
               (int *)CONCAT44((int)((ulong)in_stack_fffffffffffffe20 >> 0x20),3);
          in_stack_fffffffffffffe30 = local_a0;
          calc_sad_update_bestmv_with_indices
                    (in_stack_fffffffffffffe58,(MV_COST_PARAMS *)in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48,SUB84((ulong)in_stack_fffffffffffffe60 >> 0x20,0),
                     in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                     (uint *)CONCAT44(iVar8,iVar7),iVar2,
                     (int *)CONCAT44(uVar9,in_stack_fffffffffffffe80),(int)pFVar6,
                     (int *)mv_cost_params_00,(int *)CONCAT44(iVar1,in_stack_fffffffffffffe98));
        }
        else {
          in_stack_fffffffffffffe20 = &local_154;
          in_stack_fffffffffffffe08 = (MV_COST_PARAMS *)local_f0;
          in_stack_fffffffffffffe18 = &local_128;
          in_stack_fffffffffffffe28 = local_a0;
          calc_sad3_update_bestmv
                    (pFVar6,(MV_COST_PARAMS *)CONCAT44(uVar9,in_stack_fffffffffffffe80),
                     (FULLPEL_MV *)CONCAT44(in_stack_fffffffffffffe7c,iVar2),
                     SUB84((ulong)mv_cost_params_00 >> 0x20,0),(uint8_t *)CONCAT44(iVar8,iVar7),
                     (uint *)bestsad_00,(uint *)CONCAT44(in_stack_fffffffffffffea4,in_EDX),
                     search_step_00,(int *)CONCAT44(iVar11,iVar10),
                     (int *)CONCAT26(in_stack_fffffffffffffebe,
                                     CONCAT24(in_stack_fffffffffffffebc,
                                              CONCAT22(in_stack_fffffffffffffeba,
                                                       in_stack_fffffffffffffeb8))),
                     (int *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
        }
        if (local_128 != -1) {
          local_f4 = (&local_154)[local_128];
          local_f0._12_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_f4].mv.row +
               local_f0._12_4_;
          local_f0._8_4_ =
               (int)((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_f4].mv.col +
               local_f0._8_4_;
          local_110 = local_110 +
                      ((search_site (*) [17])local_f0._32_8_)[(int)local_b0][local_f4].offset;
        }
      }
    }
  }
  local_a8->row = (int16_t)local_f0._12_4_;
  local_a8->col = (int16_t)local_f0._8_4_;
  if (local_a0 != (FULLPEL_MOTION_SEARCH_PARAMS *)0x0) {
    local_24 = *local_a8;
    local_30 = local_90;
    local_38 = local_a0;
    local_3c = local_108;
    pFVar6 = (FULLPEL_MOTION_SEARCH_PARAMS *)(local_90->ms_buffers).src;
    local_50 = (local_90->ms_buffers).ref;
    local_54 = local_50->stride;
    local_58 = (int)local_24.row;
    local_5c = (int)local_24.col;
    local_48 = pFVar6;
    if (local_108 == 0) {
      get_buf_from_fullmv((buf_2d *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                          (FULLPEL_MV *)in_stack_fffffffffffffe08);
      iVar1 = get_mvpred_sad(in_stack_fffffffffffffe30,(buf_2d *)in_stack_fffffffffffffe28,
                             (uint8_t *)in_stack_fffffffffffffe20,
                             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
      *(int *)local_38 = iVar1;
      iVar1 = check_bounds(&local_30->mv_limits,local_58,local_5c,1);
      in_stack_fffffffffffffe58 = local_90;
      if (iVar1 == 0) {
        for (local_68 = 0; in_stack_fffffffffffffe60 = pFVar6, local_68 < 4; local_68 = local_68 + 1
            ) {
          local_6c.col = (short)local_5c +
                         *(short *)(calc_int_sad_list_neighbors + (long)local_68 * 4 + 2);
          local_6c.row = (short)local_58 +
                         *(short *)(calc_int_sad_list_neighbors + (long)local_68 * 4);
          iVar1 = av1_is_fullmv_in_range(&local_30->mv_limits,local_6c);
          if (iVar1 == 0) {
            *(undefined4 *)((long)local_38->mesh_patterns + (long)(local_68 + 1) * 4 + -0x78) =
                 0x7fffffff;
          }
          else {
            get_buf_from_fullmv((buf_2d *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                (FULLPEL_MV *)in_stack_fffffffffffffe08);
            iVar1 = get_mvpred_sad(in_stack_fffffffffffffe30,(buf_2d *)in_stack_fffffffffffffe28,
                                   (uint8_t *)in_stack_fffffffffffffe20,
                                   (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
            *(int *)((long)local_38->mesh_patterns + (long)(local_68 + 1) * 4 + -0x78) = iVar1;
          }
        }
      }
      else {
        for (local_60 = 0; in_stack_fffffffffffffe60 = pFVar6, local_60 < 4; local_60 = local_60 + 1
            ) {
          local_64 = (short)local_58 + *(short *)(calc_int_sad_list_neighbors + (long)local_60 * 4);
          local_62 = (short)local_5c +
                     *(short *)(calc_int_sad_list_neighbors + (long)local_60 * 4 + 2);
          in_stack_fffffffffffffe50 = local_48;
          get_buf_from_fullmv((buf_2d *)
                              CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                              (FULLPEL_MV *)in_stack_fffffffffffffe08);
          iVar1 = get_mvpred_sad(in_stack_fffffffffffffe30,(buf_2d *)in_stack_fffffffffffffe28,
                                 (uint8_t *)in_stack_fffffffffffffe20,
                                 (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
          *(int *)((long)local_38->mesh_patterns + (long)(local_60 + 1) * 4 + -0x78) = iVar1;
        }
      }
    }
    local_78 = &local_30->mv_cost_params;
    iVar1 = mvsad_err_cost_((FULLPEL_MV *)
                            CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                            in_stack_fffffffffffffe08);
    *(int *)local_38 = iVar1 + *(int *)local_38;
    for (local_7c = 0; local_7c < 4; local_7c = local_7c + 1) {
      if (*(int *)((long)local_38->mesh_patterns + (long)(local_7c + 1) * 4 + -0x78) != 0x7fffffff)
      {
        local_80 = (short)local_58 + *(short *)(calc_int_sad_list_neighbors + (long)local_7c * 4);
        local_7e = (short)local_5c +
                   *(short *)(calc_int_sad_list_neighbors + (long)local_7c * 4 + 2);
        iVar1 = mvsad_err_cost_((FULLPEL_MV *)
                                CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                                in_stack_fffffffffffffe08);
        *(int *)((long)local_38->mesh_patterns + (long)(local_7c + 1) * 4 + -0x78) =
             iVar1 + *(int *)((long)local_38->mesh_patterns + (long)(local_7c + 1) * 4 + -0x78);
      }
    }
  }
  iVar1 = get_mvpred_var_cost(in_stack_fffffffffffffe60,(FULLPEL_MV *)in_stack_fffffffffffffe58,
                              (FULLPEL_MV_STATS *)in_stack_fffffffffffffe50);
  return iVar1;
}

Assistant:

static int pattern_search(FULLPEL_MV start_mv,
                          const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                          int search_step, const int do_init_search,
                          int *cost_list, FULLPEL_MV *best_mv,
                          FULLPEL_MV_STATS *best_mv_stats) {
  static const int search_steps[MAX_MVSEARCH_STEPS] = {
    10, 9, 8, 7, 6, 5, 4, 3, 2, 1, 0,
  };
  int i, s, t;

  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site_config *search_sites = ms_params->search_sites;
  const int *num_candidates = search_sites->searches_per_step;
  const int ref_stride = ref->stride;
  const int last_is_4 = num_candidates[0] == 4;
  int br, bc;
  unsigned int bestsad = UINT_MAX, raw_bestsad = UINT_MAX;
  int k = -1;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  search_step = AOMMIN(search_step, MAX_MVSEARCH_STEPS - 1);
  assert(search_step >= 0);
  int best_init_s = search_steps[search_step];
  // adjust ref_mv to make sure it is within MV range
  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  br = start_mv.row;
  bc = start_mv.col;
  if (cost_list != NULL) {
    cost_list[0] = cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] =
        INT_MAX;
  }
  int costlist_has_sad = 0;

  // Work out the start point for the search
  raw_bestsad = get_mvpred_sad(ms_params, src,
                               get_buf_from_fullmv(ref, &start_mv), ref_stride);
  bestsad = raw_bestsad + mvsad_err_cost_(&start_mv, mv_cost_params);

  // Search all possible scales up to the search param around the center point
  // pick the scale of the point that is best as the starting scale of
  // further steps around it.
  const uint8_t *center_address = get_buf_from_fullmv(ref, &start_mv);
  if (do_init_search) {
    s = best_init_s;
    best_init_s = -1;
    for (t = 0; t <= s; ++t) {
      int best_site = -1;
      FULLPEL_MV center_mv = { br, bc };
      if (check_bounds(&ms_params->mv_limits, br, bc, 1 << t)) {
        // Call 4-point sad for multiples of 4 candidates.
        const int no_of_4_cand_loops = num_candidates[t] >> 2;
        for (i = 0; i < no_of_4_cand_loops; i++) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, t,
                                  &best_site, i * 4, /*cost_list=*/NULL);
        }
        // Rest of the candidates
        const int remaining_cand = num_candidates[t] % 4;
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, remaining_cand,
                               no_of_4_cand_loops * 4, NULL);
      } else {
        calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                               center_address, &bestsad, &raw_bestsad, t,
                               &best_site, num_candidates[t], 0, NULL);
      }
      if (best_site == -1) {
        continue;
      } else {
        best_init_s = t;
        k = best_site;
      }
    }
    if (best_init_s != -1) {
      br += search_sites->site[best_init_s][k].mv.row;
      bc += search_sites->site[best_init_s][k].mv.col;
      center_address += search_sites->site[best_init_s][k].offset;
    }
  }

  // If the center point is still the best, just skip this and move to
  // the refinement step.
  if (best_init_s != -1) {
    const int last_s = (last_is_4 && cost_list != NULL);
    int best_site = -1;
    s = best_init_s;

    for (; s >= last_s; s--) {
      // No need to search all points the 1st time if initial search was used
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          // Call 4-point sad for multiples of 4 candidates.
          const int no_of_4_cand_loops = num_candidates[s] >> 2;
          for (i = 0; i < no_of_4_cand_loops; i++) {
            calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv,
                                    center_mv, center_address, &bestsad,
                                    &raw_bestsad, s, &best_site, i * 4,
                                    /*cost_list=*/NULL);
          }
          // Rest of the candidates
          const int remaining_cand = num_candidates[s] % 4;
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, remaining_cand,
                                 no_of_4_cand_loops * 4, NULL);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, num_candidates[s], 0, NULL);
        }

        if (best_site == -1) {
          continue;
        } else {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }

      do {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, NULL);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, NULL);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      } while (best_site != -1);
    }
    // Note: If we enter the if below, then cost_list must be non-NULL.
    if (s == 0) {
      cost_list[0] = raw_bestsad;
      costlist_has_sad = 1;
      assert(num_candidates[s] == 4);
      if (!do_init_search || s != best_init_s) {
        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          calc_sad4_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, 0, cost_list);
        } else {
          calc_sad_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                 center_address, &bestsad, &raw_bestsad, s,
                                 &best_site, /*num_candidates=*/4,
                                 /*cand_start=*/0, cost_list);
        }

        if (best_site != -1) {
          br += search_sites->site[s][best_site].mv.row;
          bc += search_sites->site[s][best_site].mv.col;
          center_address += search_sites->site[s][best_site].offset;
          k = best_site;
        }
      }
      while (best_site != -1) {
        int next_chkpts_indices[PATTERN_CANDIDATES_REF];
        best_site = -1;
        next_chkpts_indices[0] = (k == 0) ? num_candidates[s] - 1 : k - 1;
        next_chkpts_indices[1] = k;
        next_chkpts_indices[2] = (k == num_candidates[s] - 1) ? 0 : k + 1;
        cost_list[1] = cost_list[2] = cost_list[3] = cost_list[4] = INT_MAX;
        cost_list[((k + 2) % 4) + 1] = cost_list[0];
        cost_list[0] = raw_bestsad;

        FULLPEL_MV center_mv = { br, bc };
        if (check_bounds(&ms_params->mv_limits, br, bc, 1 << s)) {
          assert(PATTERN_CANDIDATES_REF == 3);
          calc_sad3_update_bestmv(ms_params, mv_cost_params, best_mv, center_mv,
                                  center_address, &bestsad, &raw_bestsad, s,
                                  &best_site, next_chkpts_indices, cost_list);
        } else {
          calc_sad_update_bestmv_with_indices(
              ms_params, mv_cost_params, best_mv, center_mv, center_address,
              &bestsad, &raw_bestsad, s, &best_site, PATTERN_CANDIDATES_REF,
              next_chkpts_indices, cost_list);
        }

        if (best_site != -1) {
          k = next_chkpts_indices[best_site];
          br += search_sites->site[s][k].mv.row;
          bc += search_sites->site[s][k].mv.col;
          center_address += search_sites->site[s][k].offset;
        }
      }
    }
  }
  best_mv->row = br;
  best_mv->col = bc;

  assert(center_address == get_buf_from_fullmv(ref, best_mv) &&
         "center address is out of sync with best_mv!\n");

  // Returns the one-away integer pel cost/sad around the best as follows:
  // cost_list[0]: cost/sad at the best integer pel
  // cost_list[1]: cost/sad at delta {0, -1} (left)   from the best integer pel
  // cost_list[2]: cost/sad at delta { 1, 0} (bottom) from the best integer pel
  // cost_list[3]: cost/sad at delta { 0, 1} (right)  from the best integer pel
  // cost_list[4]: cost/sad at delta {-1, 0} (top)    from the best integer pel
  if (cost_list) {
    if (USE_SAD_COSTLIST) {
      calc_int_sad_list(*best_mv, ms_params, cost_list, costlist_has_sad);
    } else {
      calc_int_cost_list(*best_mv, ms_params, cost_list);
    }
  }

  const int var_cost = get_mvpred_var_cost(ms_params, best_mv, best_mv_stats);
  return var_cost;
}